

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O2

void crnlib::MatchFinder_Init(CMatchFinder *p)

{
  UInt32 i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < p->hashSizeSum; uVar1 = uVar1 + 1) {
    p->hash[uVar1] = 0;
  }
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->streamPos = p->cyclicBufferSize;
  p->pos = p->cyclicBufferSize;
  p->result = 0;
  p->streamEndWasReached = 0;
  MatchFinder_ReadBlock(p);
  MatchFinder_SetLimits(p);
  return;
}

Assistant:

void MatchFinder_Init(CMatchFinder* p) {
  UInt32 i;
  for (i = 0; i < p->hashSizeSum; i++)
    p->hash[i] = kEmptyHashValue;
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->pos = p->streamPos = p->cyclicBufferSize;
  p->result = SZ_OK;
  p->streamEndWasReached = 0;
  MatchFinder_ReadBlock(p);
  MatchFinder_SetLimits(p);
}